

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ungetc.c
# Opt level: O0

int ungetc(int __c,FILE *__stream)

{
  char *pcVar1;
  uint local_1c;
  int rc;
  _PDCLIB_file_t *stream_local;
  int c_local;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  if ((__c == -1) || (__stream->_IO_buf_base == (char *)0x1)) {
    local_1c = 0xffffffff;
  }
  else {
    pcVar1 = __stream->_IO_buf_base;
    __stream->_IO_buf_base = pcVar1 + 1;
    *(char *)((long)&__stream->_IO_buf_end + (long)pcVar1) = (char)__c;
    local_1c = __c & 0xff;
  }
  mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  return local_1c;
}

Assistant:

int ungetc( int c, struct _PDCLIB_file_t * stream )
{
    int rc;

    _PDCLIB_LOCK( stream->mtx );

    if ( c == EOF || stream->ungetidx == _PDCLIB_UNGETCBUFSIZE )
    {
        rc = -1;
    }
    else
    {
        rc = stream->ungetbuf[stream->ungetidx++] = ( unsigned char ) c;
    }

    _PDCLIB_UNLOCK( stream->mtx );

    return rc;
}